

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

Var Js::TaggedInt::ShiftRightU(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint64 uVar5;
  uint64 uVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  Var pvVar10;
  uint uVar11;
  double value;
  
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      pcVar8 = "(Is(aValue))";
      pcVar7 = "Ensure var is actually a \'TaggedInt\'";
      uVar11 = 0x51;
      goto LAB_00b0c4b5;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    pcVar8 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar7 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar11 = 0x2a;
LAB_00b0c4b5:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,uVar11,pcVar8,pcVar7);
    if (!bVar3) goto LAB_00b0c66d;
    *puVar4 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      pcVar8 = "(Is(aValue))";
      pcVar7 = "Ensure var is actually a \'TaggedInt\'";
      uVar11 = 0x51;
      goto LAB_00b0c578;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    pcVar8 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar7 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar11 = 0x2a;
LAB_00b0c578:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,uVar11,pcVar8,pcVar7);
    if (!bVar3) goto LAB_00b0c66d;
    *puVar4 = 0;
  }
  bVar1 = (byte)aRight & 0x1f;
  uVar9 = (uint)aLeft >> bVar1;
  if ((int)((uint)aLeft >> bVar1) < 0) {
    value = (double)uVar9;
    uVar5 = NumberUtilities::ToSpecial(value);
    bVar3 = NumberUtilities::IsNan(value);
    if (bVar3) {
      uVar6 = NumberUtilities::ToSpecial(value);
      if (uVar6 != 0xfff8000000000000) {
        uVar6 = NumberUtilities::ToSpecial(value);
        if (uVar6 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) {
LAB_00b0c66d:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
      }
    }
    pvVar10 = (Var)(uVar5 ^ 0xfffc000000000000);
  }
  else {
    pvVar10 = (Var)((ulong)uVar9 | 0x1000000000000);
  }
  return pvVar10;
}

Assistant:

Var TaggedInt::ShiftRightU(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        //
        // If aLeft was an Int31 coming in, then the result must always be an Int31 going out because
        // shifting right only makes value smaller. Therefore, we may call ToVarUnchecked()
        // directly.
        //

        uint32 uValue   = ToUInt32(aLeft);
        uint32 nShift   = ToUInt32(aRight);

        return JavascriptNumber::ToVar(uValue >> (nShift & 0x1F), scriptContext);
    }